

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crypto.cpp
# Opt level: O2

void __thiscall cppcms::crypto::key::set_hex(key *this,char *ptr,size_t len)

{
  uint uVar1;
  uint uVar2;
  char *pcVar3;
  invalid_argument *piVar4;
  uint uVar5;
  long lVar6;
  uint h;
  allocator local_51;
  string local_50;
  
  reset(this);
  if (len != 0) {
    if ((len & 1) != 0) {
      piVar4 = (invalid_argument *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)&local_50,
                 "cppcms::crypto::key: the hexadecimal key length is not multiple of 2",&local_51);
      booster::invalid_argument::invalid_argument(piVar4,&local_50);
      __cxa_throw(piVar4,&booster::invalid_argument::typeinfo,
                  booster::invalid_argument::~invalid_argument);
    }
    for (uVar1 = 0; uVar1 < len; uVar1 = uVar1 + 1) {
      if ((9 < (byte)(ptr[uVar1] - 0x30U)) &&
         ((uVar5 = (byte)ptr[uVar1] - 0x41, 0x25 < uVar5 ||
          ((0x3f0000003fU >> ((ulong)uVar5 & 0x3f) & 1) == 0)))) {
        piVar4 = (invalid_argument *)__cxa_allocate_exception(0x30);
        std::__cxx11::string::string
                  ((string *)&local_50,
                   "cppcms::crypto::key: the hexadecimal key has invalid characters",&local_51);
        booster::invalid_argument::invalid_argument(piVar4,&local_50);
        __cxa_throw(piVar4,&booster::invalid_argument::typeinfo,
                    booster::invalid_argument::~invalid_argument);
      }
    }
    this->size_ = len >> 1;
    pcVar3 = (char *)operator_new__(len >> 1);
    this->data_ = pcVar3;
    lVar6 = 0;
    for (uVar1 = 0; uVar1 < (uint)len; uVar1 = uVar1 + 2) {
      uVar5 = from_hex(ptr[lVar6 * 2]);
      uVar2 = from_hex(ptr[lVar6 * 2 + 1]);
      this->data_[lVar6] = (byte)uVar2 | (byte)(uVar5 << 4);
      lVar6 = lVar6 + 1;
    }
  }
  return;
}

Assistant:

void key::set_hex(char const *ptr,size_t len)
	{
		reset();
		if(len == 0)
			return;
		if(len % 2 != 0) {
			throw booster::invalid_argument("cppcms::crypto::key: the hexadecimal key length is not multiple of 2");
		}
		for(unsigned i=0;i<len;i++) {
			char c=ptr[i];
			if(	('0'<=c && c<='9')
				|| ('a' <= c && c<='f')
				|| ('A' <= c && c<='F')
			  )
			{
				continue;
			}
			throw booster::invalid_argument("cppcms::crypto::key: the hexadecimal key has invalid characters");
		}
		size_ = len / 2;
		data_ = new char[size_];
		for(unsigned h=0,b=0;h<len;h+=2,b++) {
			data_[b] = (from_hex(ptr[h]) << 4) + from_hex(ptr[h+1]);
		}
	}